

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  char *pcVar7;
  char *in_RCX;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int timeo;
  nn_thread thread3;
  nn_thread thread2;
  nn_thread thread1;
  undefined1 local_428 [1032];
  
  nn_thread_init(&thread1,device1,(void *)0x0);
  iVar2 = test_socket_impl((char *)0x76,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x77,iVar2,0x102175,in_RCX);
  iVar3 = test_socket_impl((char *)0x78,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x79,iVar3,0x102180,in_RCX);
  test_send_impl((char *)0x7c,iVar2,0x102222,in_RCX);
  test_recv_impl((char *)0x7d,iVar3,0x102222,in_RCX);
  test_send_impl((char *)0x7e,iVar3,0x102222,in_RCX);
  test_recv_impl((char *)0x7f,iVar2,0x102222,in_RCX);
  test_close_impl((char *)0x82,iVar3,sock);
  test_close_impl((char *)0x83,iVar2,sock_00);
  nn_thread_init(&thread2,device2,(void *)0x0);
  iVar2 = test_socket_impl((char *)0x8b,1,0x50,(int)in_RCX);
  test_connect_impl((char *)0x8c,iVar2,0x1021e2,in_RCX);
  iVar3 = test_socket_impl((char *)0x8d,1,0x51,(int)in_RCX);
  test_connect_impl((char *)0x8e,iVar3,0x1021ed,in_RCX);
  test_send_impl((char *)0x91,iVar2,0x102226,in_RCX);
  test_recv_impl((char *)0x92,iVar3,0x102226,in_RCX);
  test_close_impl((char *)0x95,iVar3,sock_01);
  test_close_impl((char *)0x96,iVar2,sock_02);
  nn_thread_init(&thread3,device3,(void *)0x0);
  iVar2 = test_socket_impl((char *)0x9e,1,0x70,(int)in_RCX);
  test_connect_impl((char *)0x9f,iVar2,0x102217,in_RCX);
  iVar3 = test_socket_impl((char *)0xa0,1,0x70,(int)in_RCX);
  test_connect_impl((char *)0xa1,iVar3,0x102217,in_RCX);
  nn_sleep(100);
  test_send_impl((char *)0xa7,iVar2,0x10222a,in_RCX);
  test_recv_impl((char *)0xa8,iVar3,0x10222a,in_RCX);
  timeo = 100;
  iVar4 = nn_setsockopt(iVar2,0,5,&timeo,4);
  pFVar1 = _stderr;
  if (iVar4 < 0) {
    puVar6 = (uint *)__errno_location();
    pcVar7 = nn_err_strerror(*puVar6);
    fprintf(pFVar1,"Failed set option \"%d\": %s [%d] (%s:%d)\n",5,pcVar7,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
            ,0xae);
    nn_err_abort();
  }
  uVar5 = nn_recv(iVar2,local_428,0x400,0);
  if ((int)uVar5 < 0) {
    puVar6 = (uint *)__errno_location();
    pFVar1 = _stderr;
    if (*puVar6 == 0x6e) {
      test_close_impl((char *)0xb2,iVar3,sock_03);
      test_close_impl((char *)0xb3,iVar2,sock_04);
      nn_term();
      nn_thread_term(&thread1);
      nn_thread_term(&thread2);
      nn_thread_term(&thread3);
      return 0;
    }
    pcVar7 = nn_err_strerror(*puVar6);
    fprintf(pFVar1,"Got wrong err to recv: %s [%d != %d] (%s:%d)\n",pcVar7,(ulong)*puVar6,0x6e,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
            ,0xaf);
    nn_err_abort();
  }
  fprintf(_stderr,"Did not drop message: [%d bytes] (%s:%d)\n",(ulong)uVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c",
          0xaf);
  nn_err_abort();
}

Assistant:

int main ()
{
    int enda;
    int endb;
    int endc;
    int endd;
    int ende1;
    int ende2;
    struct nn_thread thread1;
    struct nn_thread thread2;
    struct nn_thread thread3;
    int timeo;

    /*  Test the bi-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread1, device1, NULL);

    /*  Create two sockets to connect to the device. */
    enda = test_socket (AF_SP, NN_PAIR);
    test_connect (enda, SOCKET_ADDRESS_A);
    endb = test_socket (AF_SP, NN_PAIR);
    test_connect (endb, SOCKET_ADDRESS_B);

    /*  Pass a pair of messages between endpoints. */
    test_send (enda, "ABC");
    test_recv (endb, "ABC");
    test_send (endb, "ABC");
    test_recv (enda, "ABC");

    /*  Clean up. */
    test_close (endb);
    test_close (enda);

    /*  Test the uni-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread2, device2, NULL);

    /*  Create two sockets to connect to the device. */
    endc = test_socket (AF_SP, NN_PUSH);
    test_connect (endc, SOCKET_ADDRESS_C);
    endd = test_socket (AF_SP, NN_PULL);
    test_connect (endd, SOCKET_ADDRESS_D);

    /*  Pass a message between endpoints. */
    test_send (endc, "XYZ");
    test_recv (endd, "XYZ");

    /*  Clean up. */
    test_close (endd);
    test_close (endc);

    /*  Test the loopback device. */

    /*  Start the device. */
    nn_thread_init (&thread3, device3, NULL);

    /*  Create two sockets to connect to the device. */
    ende1 = test_socket (AF_SP, NN_BUS);
    test_connect (ende1, SOCKET_ADDRESS_E);
    ende2 = test_socket (AF_SP, NN_BUS);
    test_connect (ende2, SOCKET_ADDRESS_E);

    /*  BUS is unreliable so wait a bit for connections to be established. */
    nn_sleep (100);

    /*  Pass a message to the bus. */
    test_send (ende1, "KLM");
    test_recv (ende2, "KLM");

    /*  Make sure that the message doesn't arrive at the socket it was
        originally sent to. */
    timeo = 100;
    test_setsockopt (ende1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    test_drop (ende1, ETIMEDOUT);

    /*  Clean up. */
    test_close (ende2);
    test_close (ende1);

    /*  Shut down the devices. */
    nn_term ();
    nn_thread_term (&thread1);
    nn_thread_term (&thread2);
    nn_thread_term (&thread3);

    return 0;
}